

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<true> *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDX;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  SizeType memberCount;
  bool in_stack_00000057;
  VWReaderHandler<true> *in_stack_00000058;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_stack_00000060;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
  *in_stack_00000068;
  undefined4 in_stack_ffffffffffffffa8;
  ParseErrorCode in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  
  GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
  bVar1 = VWReaderHandler<true>::StartObject((VWReaderHandler<true> *)in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError(in_RDI,in_stack_ffffffffffffffac,0x268c3d);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x268c49);
    if (bVar1) {
      return;
    }
  }
  SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
            (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x268c77);
  if (!bVar1) {
    CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
    if (CVar2 == '}') {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
      bVar1 = VWReaderHandler<true>::EndObject
                        ((VWReaderHandler<true> *)in_RDI,in_stack_ffffffffffffffac);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError(in_RDI,in_stack_ffffffffffffffac,0x268d0b);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)0x268d17);
      }
    }
    else {
      iVar3 = 0;
      do {
        while( true ) {
          CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
          if (CVar2 != '\"') {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError(in_RDI,in_stack_ffffffffffffffac,0x268d76);
            bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)0x268d82);
            if (bVar1) {
              return;
            }
          }
          ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000057);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x268dba);
          if (bVar1) {
            return;
          }
          SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x268de4);
          if (bVar1) {
            return;
          }
          CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
          if (CVar2 == ':') {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
          }
          else {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError(in_RDI,in_stack_ffffffffffffffac,0x268e67);
            bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)0x268e73);
            if (bVar1) {
              return;
            }
          }
          SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x268ea1);
          if (bVar1) {
            return;
          }
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (in_RDX,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                            CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                     (VWReaderHandler<true> *)in_RDI);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x268ed0);
          if (bVar1) {
            return;
          }
          SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x268efa);
          if (bVar1) {
            return;
          }
          iVar3 = iVar3 + 1;
          CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(in_RSI);
          in_stack_ffffffffffffffac = (ParseErrorCode)CVar2;
          if (in_stack_ffffffffffffffac == 0x2c) break;
          if (in_stack_ffffffffffffffac == 0x7d) {
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
            bVar1 = VWReaderHandler<true>::EndObject
                              ((VWReaderHandler<true> *)in_RDI,in_stack_ffffffffffffffac);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError(in_RDI,in_stack_ffffffffffffffac,0x268fb8);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x268fc4);
            return;
          }
          GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(in_RSI);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError(in_RDI,in_stack_ffffffffffffffac,0x268ff8);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x269004);
          if (bVar1) {
            return;
          }
        }
        GenericInsituStringStream<rapidjson::UTF8<char>_>::Take(in_RSI);
        SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                  (in_RDI,(GenericInsituStringStream<rapidjson::UTF8<char>_> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x268f5e);
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }